

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

void Hex::Hexdumper<char>::output_bin(ostream *os,remove_const_t<char> val)

{
  undefined8 uVar1;
  char cVar2;
  char cVar3;
  int len;
  ulong uVar4;
  undefined8 uStack_130;
  char bits [257];
  
  for (uVar4 = 0; (val != 0 && (uVar4 < 0x100)); uVar4 = uVar4 + 1) {
    bits[uVar4] = val & 1U | 0x30;
    val = val >> 1;
  }
  bits[uVar4] = '\0';
  uVar1 = *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10);
  uStack_130 = 0x12646a;
  cVar2 = std::ios::fill();
  if ((int)uVar4 < (int)uVar1) {
    cVar3 = ' ';
    if (cVar2 != '\0') {
      cVar3 = cVar2;
    }
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)((int)uVar1 - (int)uVar4);
    while( true ) {
      uStack_130 = 0x1264b4;
      std::operator<<(os,cVar3);
LAB_0012649e:
      if ((long)uVar4 < 1) break;
      cVar3 = bits[uVar4 - 1];
      uVar4 = uVar4 - 1;
    }
    return;
  }
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  goto LAB_0012649e;
}

Assistant:

static void output_bin(std::ostream& os, std::remove_const_t<T> val)
    {
        char bits[257];
        int len = 0;
        while (val && len<256) {
            bits[len++] = (val&1) ? '1' : '0';
            val >>= 1;
        }
        bits[len] = 0;

        int width = os.width();
        char fill = os.fill();
        if (!fill) fill = ' ';
        if (width>len) {
            os << std::setw(width-len);
            os << fill;
        }
        else {
            os << std::setw(0);
        }

        for (int i=len-1 ; i>=0 ; i--)
            os << bits[i];
    }